

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexLower<absl::lts_20250127::uint128>(IntDigits *this,uint128 v)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long uVar3;
  char *table;
  char *p;
  IntDigits *this_local;
  uint128 v_local;
  
  v_local.lo_ = v.hi_;
  this_local = (IntDigits *)v.lo_;
  pcVar2 = &this->field_0x3c;
  do {
    table = pcVar2;
    pcVar2 = table + -2;
    uVar3 = uint128::operator_cast_to_unsigned_long((uint128 *)&this_local);
    *(undefined2 *)pcVar2 = *(undefined2 *)(numbers_internal::kHexTable + (uVar3 & 0xff) * 2);
    uint128::operator>>=((uint128 *)&this_local,8);
    bVar1 = uint128::operator_cast_to_bool((uint128 *)&this_local);
  } while (bVar1);
  if (*pcVar2 == '0') {
    pcVar2 = table + -1;
  }
  table = pcVar2;
  this->start_ = table;
  this->size_ = (long)this + (0x3c - (long)table);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }